

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O2

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetInlineeForTargetInlinee
          (FunctionCodeGenRuntimeData *this,ProfileId profiledCallSiteId,
          FunctionBody *inlineeFuncBody)

{
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar1;
  FunctionCodeGenRuntimeData *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  
  if (((this->functionBody).ptr)->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x33,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pWVar1 = (this->inlinees).ptr;
  if (pWVar1 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    pTVar6 = pWVar1 + profiledCallSiteId;
    while (pFVar2 = pTVar6->ptr, pFVar2 != (FunctionCodeGenRuntimeData *)0x0) {
      if ((pFVar2->functionBody).ptr == inlineeFuncBody) {
        return pFVar2;
      }
      pTVar6 = &pFVar2->next;
    }
  }
  return (FunctionCodeGenRuntimeData *)0x0;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionCodeGenRuntimeData::GetInlineeForTargetInlinee(const ProfileId profiledCallSiteId, FunctionBody *inlineeFuncBody) const
    {
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());

        if (!inlinees)
        {
            return nullptr;
        }
        FunctionCodeGenRuntimeData *runtimeData = inlinees[profiledCallSiteId];
        while (runtimeData && runtimeData->GetFunctionBody() != inlineeFuncBody)
        {
            runtimeData = runtimeData->next;
        }
        return runtimeData;
    }